

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O1

void __thiscall
cmCPackIFWPackage::DependenceStruct::DependenceStruct(DependenceStruct *this,string *dependence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_type sVar3;
  pointer pcVar4;
  int iVar5;
  long lVar6;
  size_type sVar7;
  ulong uVar8;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  long local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  paVar1 = &(this->Name).field_2;
  (this->Name)._M_dataplus._M_p = (pointer)paVar1;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Compare).Type = 0;
  local_38 = &(this->Compare).Value.field_2;
  (this->Compare).Value._M_dataplus._M_p = (pointer)local_38;
  (this->Compare).Value._M_string_length = 0;
  (this->Compare).Value.field_2._M_local_buf[0] = '\0';
  lVar6 = std::__cxx11::string::find((char)dependence,0x3a);
  if (lVar6 == -1) {
    lVar6 = std::__cxx11::string::find((char)dependence,0x2d);
  }
  if (lVar6 == -1) {
    std::__cxx11::string::_M_assign((string *)this);
    return;
  }
  std::__cxx11::string::substr((ulong)&local_60,(ulong)dependence);
  std::__cxx11::string::operator=((string *)this,(string *)&local_60);
  if ((long *)local_60._M_len != local_50) {
    operator_delete((void *)local_60._M_len,local_50[0] + 1);
  }
  sVar7 = lVar6 + 1;
  sVar3 = dependence->_M_string_length;
  uVar8 = sVar3 - sVar7;
  if (uVar8 == 0) {
    return;
  }
  pcVar4 = (dependence->_M_dataplus)._M_p;
  pcVar2 = pcVar4 + sVar7;
  __str._M_str = "<=";
  __str._M_len = 2;
  local_60._M_len = uVar8;
  local_60._M_str = pcVar2;
  local_40 = paVar1;
  iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_60,0,2,__str);
  if (iVar5 == 0) {
    (this->Compare).Type = 3;
    if (uVar8 < 2) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",2,
                 uVar8);
    }
    local_60._M_len = (size_t)local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar2 + 2,pcVar4 + sVar3);
  }
  else {
    __str_00._M_str = ">=";
    __str_00._M_len = 2;
    local_60._M_len = uVar8;
    local_60._M_str = pcVar2;
    iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_60,0,2,__str_00);
    if (iVar5 == 0) {
      (this->Compare).Type = 5;
      if (uVar8 < 2) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",2,
                   uVar8);
      }
      local_60._M_len = (size_t)local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar2 + 2,pcVar4 + sVar3)
      ;
    }
    else {
      if (sVar3 != sVar7) {
        if (*pcVar2 == '<') {
          (this->Compare).Type = 2;
          if (sVar3 == sVar7) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",1,uVar8);
          }
          local_60._M_len = (size_t)local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,pcVar2 + 1,pcVar4 + sVar3);
          goto LAB_001d4b5b;
        }
        if (sVar3 != sVar7) {
          if (*pcVar2 == '=') {
            (this->Compare).Type = 1;
            if (sVar3 == sVar7) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",1,uVar8);
            }
            local_60._M_len = (size_t)local_50;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_60,pcVar2 + 1,pcVar4 + sVar3);
            goto LAB_001d4b5b;
          }
          if ((sVar3 != sVar7) && (*pcVar2 == '>')) {
            (this->Compare).Type = 4;
            if (sVar3 == sVar7) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",1,uVar8);
            }
            local_60._M_len = (size_t)local_50;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_60,pcVar2 + 1,pcVar4 + sVar3);
            goto LAB_001d4b5b;
          }
        }
      }
      (this->Compare).Type = 1;
      local_60._M_len = (size_t)local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar2,pcVar4 + sVar3);
    }
  }
LAB_001d4b5b:
  std::__cxx11::string::operator=((string *)&(this->Compare).Value,(string *)&local_60);
  if ((long *)local_60._M_len != local_50) {
    operator_delete((void *)local_60._M_len,local_50[0] + 1);
  }
  return;
}

Assistant:

cmCPackIFWPackage::DependenceStruct::DependenceStruct(
  const std::string& dependence)
{
  // Preferred format is name and version are separated by a colon (:), but
  // note that this is only supported with QtIFW 3.1 or later. Backward
  // compatibility allows a hyphen (-) as a separator instead, but names then
  // cannot contain a hyphen.
  size_t pos;
  if ((pos = dependence.find(':')) == std::string::npos) {
    pos = dependence.find('-');
  }

  if (pos != std::string::npos) {
    this->Name = dependence.substr(0, pos);
    ++pos;
    if (pos == dependence.size()) {
      // Nothing after the separator. Treat this as no version constraint.
      return;
    }

    const auto versionPart =
      cm::string_view(dependence.data() + pos, dependence.size() - pos);

    if (cmHasLiteralPrefix(versionPart, "<=")) {
      this->Compare.Type = cmCPackIFWPackage::CompareLessOrEqual;
      this->Compare.Value = std::string(versionPart.substr(2));
    } else if (cmHasLiteralPrefix(versionPart, ">=")) {
      this->Compare.Type = cmCPackIFWPackage::CompareGreaterOrEqual;
      this->Compare.Value = std::string(versionPart.substr(2));
    } else if (cmHasPrefix(versionPart, '<')) {
      this->Compare.Type = cmCPackIFWPackage::CompareLess;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else if (cmHasPrefix(versionPart, '=')) {
      this->Compare.Type = cmCPackIFWPackage::CompareEqual;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else if (cmHasPrefix(versionPart, '>')) {
      this->Compare.Type = cmCPackIFWPackage::CompareGreater;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else {
      // We found no operator but a version specification is still expected to
      // follow. The default behavior is to treat this the same as =. We
      // explicitly record that as our type (it simplifies our logic a little
      // and is also clearer).
      this->Compare.Type = cmCPackIFWPackage::CompareEqual;
      this->Compare.Value = std::string(versionPart);
    }
  } else {
    this->Name = dependence;
  }
}